

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::SourceCodeInfo_Location::SerializeWithCachedSizes
          (SourceCodeInfo_Location *this,CodedOutputStream *output)

{
  uint uVar1;
  int iVar2;
  int32 iVar3;
  int size;
  char *pcVar4;
  string *psVar5;
  UnknownFieldSet *unknown_fields;
  int local_50;
  int n_2;
  int i_2;
  int n_1;
  int i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SourceCodeInfo_Location *this_local;
  
  iVar2 = path_size(this);
  if (0 < iVar2) {
    internal::WireFormatLite::WriteTag(1,WIRETYPE_LENGTH_DELIMITED,output);
    io::CodedOutputStream::WriteVarint32(output,this->_path_cached_byte_size_);
  }
  i_1 = 0;
  iVar2 = path_size(this);
  for (; i_1 < iVar2; i_1 = i_1 + 1) {
    iVar3 = path(this,i_1);
    internal::WireFormatLite::WriteInt32NoTag(iVar3,output);
  }
  iVar2 = span_size(this);
  if (0 < iVar2) {
    internal::WireFormatLite::WriteTag(2,WIRETYPE_LENGTH_DELIMITED,output);
    io::CodedOutputStream::WriteVarint32(output,this->_span_cached_byte_size_);
  }
  i_2 = 0;
  iVar2 = span_size(this);
  for (; i_2 < iVar2; i_2 = i_2 + 1) {
    iVar3 = span(this,i_2);
    internal::WireFormatLite::WriteInt32NoTag(iVar3,output);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    leading_comments_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    leading_comments_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.SourceCodeInfo.Location.leading_comments");
    psVar5 = leading_comments_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(3,psVar5,output);
  }
  if ((uVar1 & 2) != 0) {
    trailing_comments_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    trailing_comments_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.SourceCodeInfo.Location.trailing_comments");
    psVar5 = trailing_comments_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(4,psVar5,output);
  }
  local_50 = 0;
  iVar2 = leading_detached_comments_size(this);
  for (; local_50 < iVar2; local_50 = local_50 + 1) {
    leading_detached_comments_abi_cxx11_(this,local_50);
    pcVar4 = (char *)std::__cxx11::string::data();
    leading_detached_comments_abi_cxx11_(this,local_50);
    size = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,size,SERIALIZE,
               "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
    psVar5 = leading_detached_comments_abi_cxx11_(this,local_50);
    internal::WireFormatLite::WriteString(6,psVar5,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = SourceCodeInfo_Location::unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void SourceCodeInfo_Location::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.SourceCodeInfo.Location)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  if (this->path_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_path_cached_byte_size_);
  }
  for (int i = 0, n = this->path_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32NoTag(
      this->path(i), output);
  }

  // repeated int32 span = 2 [packed = true];
  if (this->span_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_span_cached_byte_size_);
  }
  for (int i = 0, n = this->span_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32NoTag(
      this->span(i), output);
  }

  cached_has_bits = _has_bits_[0];
  // optional string leading_comments = 3;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->leading_comments().data(), this->leading_comments().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.leading_comments");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      3, this->leading_comments(), output);
  }

  // optional string trailing_comments = 4;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->trailing_comments().data(), this->trailing_comments().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.trailing_comments");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      4, this->trailing_comments(), output);
  }

  // repeated string leading_detached_comments = 6;
  for (int i = 0, n = this->leading_detached_comments_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->leading_detached_comments(i).data(), this->leading_detached_comments(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      6, this->leading_detached_comments(i), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.SourceCodeInfo.Location)
}